

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

intb __thiscall TokenField::getValue(TokenField *this,ParserWalker *walker)

{
  bool bVar1;
  int iVar2;
  uintm uVar3;
  ulong uVar4;
  int iVar5;
  uint numbytes;
  int byteoff;
  ulong local_48;
  uint local_3c;
  TokenField *local_38;
  
  byteoff = this->bytestart;
  bVar1 = this->bigendian;
  iVar2 = this->byteend - byteoff;
  iVar5 = iVar2 * 8 + 8;
  uVar4 = 0;
  numbytes = iVar2 + 1;
  local_3c = numbytes;
  local_38 = this;
  for (; 3 < numbytes; numbytes = numbytes - 4) {
    uVar3 = ParserWalker::getInstructionBytes(walker,byteoff,4);
    uVar4 = uVar4 << 0x20 | (ulong)uVar3;
    byteoff = byteoff + 4;
    iVar5 = iVar5 + -0x20;
  }
  local_48 = uVar4;
  if (numbytes != 0) {
    uVar3 = ParserWalker::getInstructionBytes(walker,byteoff,numbytes);
    local_48 = uVar4 << ((byte)iVar5 & 0x3f) | (ulong)uVar3;
  }
  if (bVar1 == false) {
    byte_swap((intb *)&local_48,local_3c);
  }
  local_48 = (long)local_48 >> ((byte)local_38->shift & 0x3f);
  iVar5 = local_38->bitend - local_38->bitstart;
  if (local_38->signbit == true) {
    sign_extend((intb *)&local_48,iVar5);
  }
  else {
    zero_extend((intb *)&local_48,iVar5);
  }
  return local_48;
}

Assistant:

intb TokenField::getValue(ParserWalker &walker) const

{				// Construct value given specific instruction stream
  intb res = getInstructionBytes(walker,bytestart,byteend,bigendian);
  
  res >>= shift;
  if (signbit)
    sign_extend(res,bitend-bitstart);
  else
    zero_extend(res,bitend-bitstart);
  return res;
}